

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

nng_err http_rd_buf(nni_http_conn *conn,nni_aio *aio)

{
  size_t sVar1;
  void *pvVar2;
  nni_http_chunks *cl;
  nng_http_status status;
  undefined1 local_90 [8];
  nni_iov iov1_3;
  nni_iov iov1_2;
  nni_iov iov1_1;
  nni_iov iov1;
  nni_iov *pnStack_48;
  uint nio;
  nni_iov *iov;
  _Bool raw;
  uint8_t *puStack_38;
  nng_err rv;
  uint8_t *rbuf;
  size_t n;
  size_t cnt;
  nni_aio *aio_local;
  nni_http_conn *conn_local;
  
  n = conn->rd_put - conn->rd_get;
  iov._3_1_ = 0;
  puStack_38 = conn->buf + conn->rd_get;
  cnt = (size_t)aio;
  aio_local = (nni_aio *)conn;
  switch(conn->rd_flavor) {
  case HTTP_RD_RAW:
    iov._3_1_ = 1;
  case HTTP_RD_FULL:
    nni_aio_get_iov(aio,(uint *)((long)&iov1.iov_len + 4),&stack0xffffffffffffffb8);
    while (iov1.iov_len._4_4_ != 0 && n != 0) {
      rbuf = (uint8_t *)pnStack_48->iov_len;
      if (n < rbuf) {
        rbuf = (uint8_t *)n;
      }
      memcpy(pnStack_48->iov_buf,puStack_38,(size_t)rbuf);
      pnStack_48->iov_len = pnStack_48->iov_len - (long)rbuf;
      pnStack_48->iov_buf = rbuf + (long)pnStack_48->iov_buf;
      aio_local[4].a_inputs[2] = rbuf + (long)aio_local[4].a_inputs[2];
      puStack_38 = rbuf + (long)puStack_38;
      nni_aio_bump_count((nni_aio *)cnt,(size_t)rbuf);
      n = n - (long)rbuf;
      if (pnStack_48->iov_len == 0) {
        iov1.iov_len._4_4_ = iov1.iov_len._4_4_ - 1;
        pnStack_48 = pnStack_48 + 1;
      }
    }
    nni_aio_set_iov((nni_aio *)cnt,iov1.iov_len._4_4_,pnStack_48);
    if ((iov1.iov_len._4_4_ == 0) ||
       (((iov._3_1_ & 1) != 0 && (sVar1 = nni_aio_count((nni_aio *)cnt), sVar1 != 0)))) {
      conn_local._4_4_ = NNG_OK;
    }
    else {
      *(undefined1 *)&aio_local[4].a_reap_node.rn_next = 0;
      nni_aio_set_iov((nni_aio *)&(aio_local->a_task).task_mtx,iov1.iov_len._4_4_,pnStack_48);
      nng_stream_recv((nng_stream *)aio_local->a_count,(nng_aio *)&(aio_local->a_task).task_mtx);
      conn_local._4_4_ = NNG_EAGAIN;
    }
    break;
  case HTTP_RD_REQ:
    conn->client = true;
    iov._4_4_ = nni_http_req_parse(conn,puStack_38,n,(size_t *)&rbuf);
    *(undefined1 *)((long)&aio_local[4].a_reap_node.rn_next + 1) = 0;
    aio_local[4].a_inputs[2] = rbuf + (long)aio_local[4].a_inputs[2];
    if (aio_local[4].a_inputs[2] == aio_local[4].a_inputs[3]) {
      aio_local[4].a_inputs[3] = (void *)0x0;
      aio_local[4].a_inputs[2] = (void *)0x0;
    }
    if (iov._4_4_ == NNG_EAGAIN) {
      http_buf_pull_up((nni_http_conn *)aio_local);
      if (aio_local[4].a_inputs[3] == aio_local[4].a_inputs[1]) {
        status = NNG_HTTP_STATUS_URI_TOO_LONG;
        if (((ulong)aio_local[2].a_prov_node.ln_next & 1) != 0) {
          status = NNG_HTTP_STATUS_HEADERS_TOO_LARGE;
        }
        nng_http_set_status((nng_http *)aio_local,status,(char *)0x0);
        strcpy((char *)aio_local[4].a_inputs[0],"NNG-DISCARD: X");
        aio_local[4].a_inputs[2] = (void *)0x0;
        pvVar2 = (void *)strlen((char *)aio_local[4].a_inputs[0]);
        aio_local[4].a_inputs[3] = pvVar2;
      }
      iov1_2.iov_len = (long)aio_local[4].a_inputs[0] + (long)aio_local[4].a_inputs[3];
      iov1_1.iov_buf = (void *)((long)aio_local[4].a_inputs[1] - (long)aio_local[4].a_inputs[3]);
      *(undefined1 *)&aio_local[4].a_reap_node.rn_next = 1;
      nni_aio_set_iov((nni_aio *)&(aio_local->a_task).task_mtx,1,(nni_iov *)&iov1_2.iov_len);
      nng_stream_recv((nng_stream *)aio_local->a_count,(nng_aio *)&(aio_local->a_task).task_mtx);
    }
    conn_local._4_4_ = iov._4_4_;
    break;
  case HTTP_RD_RES:
    conn->client = false;
    iov._4_4_ = nni_http_res_parse(conn,puStack_38,n,(size_t *)&rbuf);
    *(undefined1 *)((long)&aio_local[4].a_reap_node.rn_next + 1) = 1;
    aio_local[4].a_inputs[2] = rbuf + (long)aio_local[4].a_inputs[2];
    if (aio_local[4].a_inputs[2] == aio_local[4].a_inputs[3]) {
      aio_local[4].a_inputs[3] = (void *)0x0;
      aio_local[4].a_inputs[2] = (void *)0x0;
    }
    if (iov._4_4_ == NNG_EAGAIN) {
      http_buf_pull_up((nni_http_conn *)aio_local);
      iov1_3.iov_len = (long)aio_local[4].a_inputs[0] + (long)aio_local[4].a_inputs[3];
      iov1_2.iov_buf = (void *)((long)aio_local[4].a_inputs[1] - (long)aio_local[4].a_inputs[3]);
      *(undefined1 *)&aio_local[4].a_reap_node.rn_next = 1;
      if (iov1_2.iov_buf == (void *)0x0) {
        return NNG_EMSGSIZE;
      }
      nni_aio_set_iov((nni_aio *)&(aio_local->a_task).task_mtx,1,(nni_iov *)&iov1_3.iov_len);
      nng_stream_recv((nng_stream *)aio_local->a_count,(nng_aio *)&(aio_local->a_task).task_mtx);
    }
    conn_local._4_4_ = iov._4_4_;
    break;
  case HTTP_RD_CHUNK:
    cl = (nni_http_chunks *)nni_aio_get_prov_data(aio);
    iov._4_4_ = nni_http_chunks_parse(cl,puStack_38,n,(size_t *)&rbuf);
    aio_local[4].a_inputs[2] = rbuf + (long)aio_local[4].a_inputs[2];
    if (aio_local[4].a_inputs[2] == aio_local[4].a_inputs[3]) {
      aio_local[4].a_inputs[3] = (void *)0x0;
      aio_local[4].a_inputs[2] = (void *)0x0;
    }
    if (iov._4_4_ == NNG_EAGAIN) {
      local_90 = (undefined1  [8])((long)aio_local[4].a_inputs[0] + (long)aio_local[4].a_inputs[3]);
      iov1_3.iov_buf = (void *)((long)aio_local[4].a_inputs[1] - (long)aio_local[4].a_inputs[3]);
      *(undefined1 *)&aio_local[4].a_reap_node.rn_next = 1;
      nni_aio_set_iov((nni_aio *)&(aio_local->a_task).task_mtx,1,(nni_iov *)local_90);
      nng_stream_recv((nng_stream *)aio_local->a_count,(nng_aio *)&(aio_local->a_task).task_mtx);
    }
    conn_local._4_4_ = iov._4_4_;
    break;
  case HTTP_RD_DISCARD:
    rbuf = (uint8_t *)(conn->rd_put - conn->rd_get);
    if ((uint8_t *)conn->rd_discard < rbuf) {
      rbuf = (uint8_t *)conn->rd_discard;
    }
    conn->rd_get = (size_t)(rbuf + conn->rd_get);
    conn->rd_discard = conn->rd_discard - (long)rbuf;
    http_buf_pull_up(conn);
    if (aio_local[4].a_outputs[0] == (void *)0x0) {
      conn_local._4_4_ = NNG_OK;
    }
    else {
      iov1_1.iov_len = (long)aio_local[4].a_inputs[0] + (long)aio_local[4].a_inputs[3];
      iov1.iov_buf = (void *)((long)aio_local[4].a_inputs[1] - (long)aio_local[4].a_inputs[3]);
      *(undefined1 *)&aio_local[4].a_reap_node.rn_next = 1;
      nni_aio_set_iov((nni_aio *)&(aio_local->a_task).task_mtx,1,(nni_iov *)&iov1_1.iov_len);
      nng_stream_recv((nng_stream *)aio_local->a_count,(nng_aio *)&(aio_local->a_task).task_mtx);
      conn_local._4_4_ = NNG_EAGAIN;
    }
    break;
  default:
    conn_local._4_4_ = NNG_EINVAL;
  }
  return conn_local._4_4_;
}

Assistant:

static nng_err
http_rd_buf(nni_http_conn *conn, nni_aio *aio)
{
	size_t   cnt = conn->rd_put - conn->rd_get;
	size_t   n;
	uint8_t *rbuf = conn->buf;
	nng_err  rv;
	bool     raw = false;
	nni_iov *iov;
	unsigned nio;

	rbuf += conn->rd_get;

	switch (conn->rd_flavor) {
	case HTTP_RD_RAW:
		raw = true; // FALLTHROUGH
	case HTTP_RD_FULL:
		nni_aio_get_iov(aio, &nio, &iov);
		while ((nio != 0) && (cnt != 0)) {
			// Pull up data from the buffer if possible.
			n = iov[0].iov_len;
			if (n > cnt) {
				n = cnt;
			}
			memcpy(iov[0].iov_buf, rbuf, n);
			iov[0].iov_len -= n;
			NNI_INCPTR(iov[0].iov_buf, n);
			conn->rd_get += n;
			rbuf += n;
			nni_aio_bump_count(aio, n);
			cnt -= n;

			if (iov[0].iov_len == 0) {
				nio--;
				iov = &iov[1];
			}
		}

		nni_aio_set_iov(aio, nio, iov);

		if ((nio == 0) || (raw && (nni_aio_count(aio) != 0))) {
			// Finished the read.  (We are finished if we either
			// got *all* the data, or we got *some* data for
			// a raw read.)
			return (NNG_OK);
		}

		// No more data left in the buffer, so use a physio.
		// (Note that we get here if we either have not completed
		// a full transaction on a FULL read, or were not even able
		// to get *any* data for a partial RAW read.)
		conn->buffered = false;
		nni_aio_set_iov(&conn->rd_aio, nio, iov);
		nng_stream_recv(conn->sock, &conn->rd_aio);
		return (NNG_EAGAIN);

	case HTTP_RD_DISCARD:
		n = conn->rd_put - conn->rd_get;
		if (n > conn->rd_discard) {
			n = conn->rd_discard;
		}
		conn->rd_get += n;
		conn->rd_discard -= n;
		http_buf_pull_up(conn);
		if (conn->rd_discard > 0) {
			nni_iov iov1;
			iov1.iov_buf   = conn->buf + conn->rd_put;
			iov1.iov_len   = conn->bufsz - conn->rd_put;
			conn->buffered = true;
			nni_aio_set_iov(&conn->rd_aio, 1, &iov1);
			nng_stream_recv(conn->sock, &conn->rd_aio);
			return (NNG_EAGAIN);
		}
		return (NNG_OK);

	case HTTP_RD_REQ:
		conn->client = true;
		rv           = nni_http_req_parse(conn, rbuf, cnt, &n);
		conn->client = false;
		conn->rd_get += n;
		if (conn->rd_get == conn->rd_put) {
			conn->rd_get = conn->rd_put = 0;
		}
		if (rv == NNG_EAGAIN) {
			nni_iov iov1;
			http_buf_pull_up(conn);
			if (conn->rd_put == conn->bufsz) {
				nng_http_set_status(conn,
				    conn->req.data.parsed
				        ? NNG_HTTP_STATUS_HEADERS_TOO_LARGE
				        : NNG_HTTP_STATUS_URI_TOO_LONG,
				    NULL);
				// leave a "header" so we don't confuse parsing
				// We want to ensure this is an overlong
				// request.
				strcpy((char *) conn->buf, "NNG-DISCARD: X");
				conn->rd_get = 0;
				conn->rd_put = strlen((char *) conn->buf);
			}
			iov1.iov_buf   = conn->buf + conn->rd_put;
			iov1.iov_len   = conn->bufsz - conn->rd_put;
			conn->buffered = true;
			nni_aio_set_iov(&conn->rd_aio, 1, &iov1);
			nng_stream_recv(conn->sock, &conn->rd_aio);
		}
		return (rv);

	case HTTP_RD_RES:
		conn->client = false;
		rv           = nni_http_res_parse(conn, rbuf, cnt, &n);
		conn->client = true;
		conn->rd_get += n;
		if (conn->rd_get == conn->rd_put) {
			conn->rd_get = conn->rd_put = 0;
		}
		if (rv == NNG_EAGAIN) {
			nni_iov iov1;
			http_buf_pull_up(conn);
			iov1.iov_buf   = conn->buf + conn->rd_put;
			iov1.iov_len   = conn->bufsz - conn->rd_put;
			conn->buffered = true;
			if (iov1.iov_len == 0) {
				return (NNG_EMSGSIZE);
			}
			nni_aio_set_iov(&conn->rd_aio, 1, &iov1);
			nng_stream_recv(conn->sock, &conn->rd_aio);
		}
		return (rv);

	case HTTP_RD_CHUNK:
		rv = nni_http_chunks_parse(
		    nni_aio_get_prov_data(aio), rbuf, cnt, &n);
		conn->rd_get += n;
		if (conn->rd_get == conn->rd_put) {
			conn->rd_get = conn->rd_put = 0;
		}
		if (rv == NNG_EAGAIN) {
			nni_iov iov1;
			iov1.iov_buf   = conn->buf + conn->rd_put;
			iov1.iov_len   = conn->bufsz - conn->rd_put;
			conn->buffered = true;
			nni_aio_set_iov(&conn->rd_aio, 1, &iov1);
			nng_stream_recv(conn->sock, &conn->rd_aio);
		}
		return (rv);
	}
	return (NNG_EINVAL);
}